

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::ReadSequence
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  CreateSequenceInfo *info;
  _func_int **local_18;
  
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe8,(field_id_t)deserializer,(char *)0x64);
  info = (CreateSequenceInfo *)
         unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                   ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *
                    )&stack0xffffffffffffffe8);
  Catalog::CreateSequence(this->catalog,transaction,info);
  if (local_18 != (_func_int **)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  return;
}

Assistant:

void CheckpointReader::ReadSequence(CatalogTransaction transaction, Deserializer &deserializer) {
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "sequence");
	auto &sequence_info = info->Cast<CreateSequenceInfo>();
	catalog.CreateSequence(transaction, sequence_info);
}